

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O3

bool __thiscall JFSON::Json::has_shape(Json *this,shape *types,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  undefined1 *puVar3;
  string *psVar4;
  int iVar5;
  Type TVar6;
  undefined4 extraout_var;
  long *plVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  ulong *puVar10;
  bool bVar11;
  undefined8 uVar12;
  long lVar13;
  iterator __rhs;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar5 = (**((this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_vptr_JsonValue)();
  if (iVar5 == 5) {
    bVar11 = true;
    if (types->_M_len != 0) {
      __rhs = types->_M_array;
      lVar13 = types->_M_len * 0x28;
      do {
        peVar2 = (this->m_ptr).super___shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar5 = (*peVar2->_vptr_JsonValue[0xb])(peVar2,__rhs);
        TVar6 = (**(code **)**(undefined8 **)CONCAT44(extraout_var,iVar5))();
        if (TVar6 != __rhs->second) {
          std::operator+(&local_48,"bad type for ",&__rhs->first);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
          paVar1 = &local_88.field_2;
          puVar10 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_88.field_2._M_allocated_capacity = *puVar10;
            local_88.field_2._8_8_ = plVar7[3];
            local_88._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_88.field_2._M_allocated_capacity = *puVar10;
            local_88._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_88._M_string_length = plVar7[1];
          *plVar7 = (long)puVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          dump_abi_cxx11_(&local_68,this);
          uVar12 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            uVar12 = local_88.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 < local_68._M_string_length + local_88._M_string_length) {
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              uVar12 = local_68.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_68._M_string_length + local_88._M_string_length)
            goto LAB_00106343;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_68,0,(char *)0x0,(ulong)local_88._M_dataplus._M_p);
          }
          else {
LAB_00106343:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
          }
          local_a8 = &local_98;
          puVar9 = puVar8 + 2;
          if ((undefined8 *)*puVar8 == puVar9) {
            local_98 = *puVar9;
            uStack_90 = puVar8[3];
          }
          else {
            local_98 = *puVar9;
            local_a8 = (undefined8 *)*puVar8;
          }
          local_a0 = puVar8[1];
          *puVar8 = puVar9;
          puVar8[1] = 0;
          *(undefined1 *)puVar9 = 0;
          std::__cxx11::string::operator=((string *)err,(string *)&local_a8);
          if (local_a8 != &local_98) {
            operator_delete(local_a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar1) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          psVar4 = &local_48;
          goto LAB_001063ea;
        }
        __rhs = __rhs + 1;
        lVar13 = lVar13 + -0x28;
      } while (lVar13 != 0);
    }
  }
  else {
    dump_abi_cxx11_(&local_88,this);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x109325);
    puVar9 = puVar8 + 2;
    if ((undefined8 *)*puVar8 == puVar9) {
      local_98 = *puVar9;
      uStack_90 = puVar8[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *puVar9;
      local_a8 = (undefined8 *)*puVar8;
    }
    local_a0 = puVar8[1];
    *puVar8 = puVar9;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_a8);
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    psVar4 = &local_88;
LAB_001063ea:
    puVar3 = (undefined1 *)(&(psVar4->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar3 != &psVar4->field_2) {
      operator_delete(puVar3);
    }
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Json::has_shape(const shape & types, string & err) const {
    if (!is_object()) {
        err = "expected JSON object, got " + dump();
        return false;
    }

    for (auto & item : types) {
        if ((*this)[item.first].type() != item.second) {
            err = "bad type for " + item.first + " in " + dump();
            return false;
        }
    }

    return true;
}